

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cpp
# Opt level: O0

void __thiscall slang::Diagnostics::sort(Diagnostics *this,SourceManager *sourceManager)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  anon_class_8_1_286b5932 compare;
  
  std::ranges::__stable_sort_fn::
  operator()<slang::Diagnostics_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_diagnostics_Diagnostics_cpp:143:20),_std::identity>
            ((__stable_sort_fn *)&std::ranges::stable_sort,in_RDI,in_RSI);
  return;
}

Assistant:

void Diagnostics::sort(const SourceManager& sourceManager) {
    auto compare = [&sourceManager](auto& x, auto& y) {
        SourceLocation xl = sourceManager.getFullyExpandedLoc(x.location);
        SourceLocation yl = sourceManager.getFullyExpandedLoc(y.location);

        auto xb = sourceManager.getSortKey(xl.buffer());
        auto yb = sourceManager.getSortKey(yl.buffer());
        if (xb < yb)
            return true;
        if (xb == yb) {
            if (xl.offset() < yl.offset())
                return true;
            if (xl == yl)
                return x.code < y.code;
        }
        return false;
    };

    std::ranges::stable_sort(*this, compare);
}